

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmFunctionInfo.cpp
# Opt level: O2

void __thiscall
Wasm::WasmFunctionInfo::WasmFunctionInfo
          (WasmFunctionInfo *this,ArenaAllocator *alloc,WasmSignature *signature,uint32 number)

{
  Local item;
  ArgSlot AVar1;
  ArgSlot AVar2;
  ArgSlot i;
  
  this->importedFunctionReference = (Type)0x0;
  this->m_alloc = alloc;
  AVar1 = WasmSignature::GetParamCount(signature);
  JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::GrowingArray
            (&this->m_locals,alloc,(uint)AVar1);
  (this->m_body).ptr = (FunctionBody *)0x0;
  Memory::WriteBarrierPtr<Wasm::WasmSignature>::WriteBarrierSet(&this->m_signature,signature);
  (this->m_customReader).ptr = (WasmReaderBase *)0x0;
  (this->m_name).ptr = (char16_t *)0x0;
  this->m_nameLength = 0;
  this->m_number = number;
  (this->m_readerInfo).size = 0;
  (this->m_readerInfo).startOffset = 0;
  AVar1 = 0;
  while( true ) {
    AVar2 = WasmSignature::GetParamCount(signature);
    if (AVar2 <= AVar1) break;
    item = WasmSignature::GetParam(signature,AVar1);
    JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::Add
              (&this->m_locals,item);
    AVar1 = AVar1 + 1;
  }
  return;
}

Assistant:

WasmFunctionInfo::WasmFunctionInfo(ArenaAllocator* alloc, WasmSignature* signature, uint32 number) : 
    m_alloc(alloc),
    m_signature(signature),
    m_body(nullptr),
    m_name(nullptr),
    m_customReader(nullptr),
    m_nameLength(0),
    m_number(number),
    m_locals(alloc, signature->GetParamCount())
#if DBG_DUMP
    , importedFunctionReference(nullptr)
#endif
{
    for (Js::ArgSlot i = 0; i < signature->GetParamCount(); ++i)
    {
        m_locals.Add(signature->GetParam(i));
    }
}